

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

uint ON_Font::RichTextPropertyDeviation
               (bool bPreferedRtfBold,bool bPreferedItalic,bool bPreferedUnderline,
               bool bPreferedStrikethrough,bool bAvailableRtfBold,bool bAvailableItalic,
               bool bAvailableUnderline,bool bAvailableStrikethrough)

{
  uint uVar1;
  uint uVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  uint uVar3;
  uint uVar4;
  
  uVar2 = WeightStretchStyleDeviation
                    (bPreferedRtfBold * '\x03' + Normal,Medium,bPreferedItalic + Upright,
                     bAvailableRtfBold * '\x03' + Normal,Medium,bPreferedItalic + Upright);
  uVar4 = (int)CONCAT71(in_register_00000011,bPreferedUnderline) - (uint)bAvailableUnderline;
  uVar1 = -uVar4;
  if (0 < (int)uVar4) {
    uVar1 = uVar4;
  }
  uVar3 = (int)CONCAT71(in_register_00000009,bPreferedStrikethrough) - (uint)bAvailableStrikethrough
  ;
  uVar4 = -uVar3;
  if (0 < (int)uVar3) {
    uVar4 = uVar3;
  }
  return uVar2 + (uVar4 & 0xff) + (uVar1 & 0xff) * 2;
}

Assistant:

unsigned int ON_Font::RichTextPropertyDeviation(
    bool bPreferedRtfBold,
    bool bPreferedItalic,
    bool bPreferedUnderline,
    bool bPreferedStrikethrough,
    bool bAvailableRtfBold,
    bool bAvailableItalic,
    bool bAvailableUnderline,
    bool bAvailableStrikethrough
)
{
  const ON_Font::Weight prefered_weight = bPreferedRtfBold ? ON_Font::Weight::Bold : ON_Font::Weight::Normal;
  const ON_Font::Weight available_weight = bAvailableRtfBold ? ON_Font::Weight::Bold : ON_Font::Weight::Normal;

  const ON_Font::Style prefered_style = bPreferedItalic ? ON_Font::Style::Italic : ON_Font::Style::Upright;
  const ON_Font::Style available_style = bPreferedItalic ? ON_Font::Style::Italic : ON_Font::Style::Upright;

  const unsigned int wss_dev = ON_Font::WeightStretchStyleDeviation(
    prefered_weight, ON_Font::Stretch::Medium, prefered_style,
    available_weight, ON_Font::Stretch::Medium, available_style
  );

  const unsigned int us_dev = ON_Font::UnderlinedStrikethroughDeviation(
    bPreferedUnderline,
    bPreferedStrikethrough,
    bAvailableUnderline,
    bAvailableStrikethrough
  );
  return wss_dev + us_dev;
}